

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

void Acb_PrintPatch(Acb_Ntk_t *pNtkF,Vec_Int_t *vDivs,Vec_Int_t *vUsed,abctime clk)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  timespec ts;
  timespec local_40;
  
  uVar4 = 0;
  printf("Patch has %d inputs: ",(ulong)(uint)vUsed->nSize);
  if (0 < vUsed->nSize) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      uVar1 = vUsed->pArray[lVar6];
      if (((long)(int)uVar1 < 0) || (vDivs->nSize <= (int)uVar1)) {
LAB_0039ac04:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = vDivs->pArray[(int)uVar1];
      lVar7 = (long)iVar2;
      if (lVar7 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
      }
      iVar5 = (pNtkF->vObjName).nSize;
      if (iVar5 < 1) {
        __assert_fail("Acb_NtkHasObjNames(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
      }
      if (iVar5 <= iVar2) goto LAB_0039ac04;
      pcVar3 = Abc_NamStr(pNtkF->pDesign->pStrs,(pNtkF->vObjName).pArray[lVar7]);
      iVar5 = (pNtkF->vObjWeight).nSize;
      if (iVar5 < 1) {
LAB_0039ac23:
        __assert_fail("Acb_NtkHasObjWeights(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10a,"int Acb_ObjWeight(Acb_Ntk_t *, int)");
      }
      if (iVar5 <= iVar2) goto LAB_0039ac04;
      printf("%d=%s(w=%d) ",(ulong)uVar1,pcVar3,(ulong)(uint)(pNtkF->vObjWeight).pArray[lVar7]);
      iVar5 = (pNtkF->vObjWeight).nSize;
      if (iVar5 < 1) goto LAB_0039ac23;
      if (iVar5 <= iVar2) goto LAB_0039ac04;
      uVar4 = uVar4 + (pNtkF->vObjWeight).pArray[lVar7];
      lVar6 = lVar6 + 1;
    } while (lVar6 < vUsed->nSize);
  }
  printf("\nTotal weight = %d  ",(ulong)uVar4);
  iVar5 = 3;
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%s =","Total runtime");
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar6 - clk) / 1000000.0);
  putchar(10);
  return;
}

Assistant:

void Acb_PrintPatch( Acb_Ntk_t * pNtkF, Vec_Int_t * vDivs, Vec_Int_t * vUsed, abctime clk )
{
    int i, iObj, Weight = 0;
    printf( "Patch has %d inputs: ", Vec_IntSize(vUsed) );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
    {
        printf( "%d=%s(w=%d) ", Vec_IntEntry(vUsed, i), Acb_ObjNameStr(pNtkF, iObj), Acb_ObjWeight(pNtkF, iObj) );
        Weight += Acb_ObjWeight(pNtkF, iObj);
    }
    printf( "\nTotal weight = %d  ", Weight );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clk );
    printf( "\n" );
}